

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseData.cc
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_t sVar3;
  FILE *in_RDX;
  FILE *extraout_RDX;
  char *__s1;
  undefined8 uVar4;
  _Alloc_hider _Var5;
  char *__s1_00;
  string result;
  string src_data;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (argc < 2) {
    __s1_00 = (char *)0x0;
  }
  else {
    __s1_00 = argv[1];
  }
  if (argc < 3) {
    __s1 = (char *)0x0;
  }
  else {
    __s1 = argv[2];
  }
  if (3 < argc) {
    main_cold_1();
    return 1;
  }
  paVar1 = &local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_40._M_dataplus._M_p = (pointer)paVar1;
  if ((__s1_00 == (char *)0x0) || (iVar2 = strcmp(__s1_00,"-"), in_RDX = extraout_RDX, iVar2 == 0))
  {
    phosg::read_all_abi_cxx11_(&local_80,_stdin,in_RDX);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
    uVar4 = local_80.field_2._M_allocated_capacity;
    _Var5._M_p = local_80._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_00105cd2;
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    sVar3 = strlen(__s1_00);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s1_00,__s1_00 + sVar3);
    phosg::load_file(&local_80,&local_60);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    uVar4 = local_60.field_2._M_allocated_capacity;
    _Var5._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) goto LAB_00105cd2;
  }
  operator_delete(_Var5._M_p,uVar4 + 1);
LAB_00105cd2:
  phosg::parse_data_string((string *)&local_80,&local_40,(string *)0x0,0);
  if ((__s1 == (char *)0x0) || (iVar2 = strcmp(__s1,"-"), iVar2 == 0)) {
    phosg::fwritex(_stdout,&local_80);
  }
  else {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    sVar3 = strlen(__s1);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,__s1,__s1 + sVar3);
    phosg::save_file(&local_60,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,
                    CONCAT71(local_40.field_2._M_allocated_capacity._1_7_,
                             local_40.field_2._M_local_buf[0]) + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  const char* src_filename = (argc > 1) ? argv[1] : nullptr;
  const char* dst_filename = (argc > 2) ? argv[2] : nullptr;
  if (argc > 3) {
    fprintf(stderr, "too many positional arguments given\n");
    return 1;
  }

  string src_data;
  if (!src_filename || !strcmp(src_filename, "-")) {
    src_data = read_all(stdin);
  } else {
    src_data = load_file(src_filename);
  }

  string result = parse_data_string(src_data);

  if (!dst_filename || !strcmp(dst_filename, "-")) {
    fwritex(stdout, result);
  } else {
    save_file(dst_filename, result);
  }

  return 0;
}